

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_AsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  bool bVar1;
  void *target_00;
  RecyclableObject *function_00;
  ThreadContext *threadContext;
  JavascriptMethod p_Var2;
  Arguments local_a0;
  Var local_90;
  Var retVal;
  undefined1 local_80 [8];
  Arguments args_1;
  CallInfo local_50;
  undefined1 local_48 [8];
  Arguments args;
  AutoReentrancySafeRegion autoReentrancySafeRegion;
  RecyclableObject *function;
  Var target;
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  target_00 = GetRegRawPtr<unsigned_int>(this,playout->Function);
  function_00 = OP_CallGetFunc(this,target_00);
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function_00);
  }
  threadContext = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
  AutoReentrancySafeRegion::AutoReentrancySafeRegion
            ((AutoReentrancySafeRegion *)&args.Values,threadContext);
  if (playout->Return == 0xffffffff) {
    CallInfo::CallInfo(&local_50,CallFlags_NotUsed,(uint)playout->ArgCount);
    Arguments::Arguments((Arguments *)local_48,local_50,*(Var **)(this + 0x28));
    p_Var2 = RecyclableObject::GetEntryPoint(function_00);
    Arguments::Arguments((Arguments *)&args_1.Values,(Arguments *)local_48);
    JavascriptFunction::CallFunction<true>(function_00,p_Var2,(Arguments *)&args_1.Values,false);
  }
  else {
    CallInfo::CallInfo((CallInfo *)&retVal,CallFlags_Value,(uint)playout->ArgCount);
    Arguments::Arguments((Arguments *)local_80,(CallInfo)retVal,*(Var **)(this + 0x28));
    p_Var2 = RecyclableObject::GetEntryPoint(function_00);
    Arguments::Arguments(&local_a0,(Arguments *)local_80);
    local_90 = JavascriptFunction::CallFunction<true>(function_00,p_Var2,&local_a0,false);
    SetRegRawPtr<unsigned_int>(this,playout->Return,local_90);
  }
  AutoReentrancySafeRegion::~AutoReentrancySafeRegion((AutoReentrancySafeRegion *)&args.Values);
  PopOut(this,playout->ArgCount);
  return;
}

Assistant:

void InterpreterStackFrame::OP_AsmCall(const unaligned T* playout)
    {
        Var target = GetRegRawPtr(playout->Function);

        RecyclableObject * function = OP_CallGetFunc(target);

#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif

        BEGIN_SAFE_REENTRANT_REGION(this->scriptContext->GetThreadContext())
        {
            if (playout->Return == Js::Constants::NoRegister)

            {
                Arguments args(CallInfo(CallFlags_NotUsed, playout->ArgCount), m_outParams);
                JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
            }
            else
            {
                Arguments args(CallInfo(CallFlags_Value, playout->ArgCount), m_outParams);
                Var retVal = JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                SetRegRawPtr(playout->Return, retVal);
            }
        }
        END_SAFE_REENTRANT_REGION

            PopOut(playout->ArgCount);
    }